

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::adjustPerturbedEquationOut(HEkkPrimal *this)

{
  long lVar1;
  long lVar2;
  const_reference pvVar3;
  reference pvVar4;
  long *in_RDI;
  double true_fixed_value;
  double lp_upper;
  double lp_lower;
  HighsSimplexInfo *info;
  HighsLp *lp;
  double local_28;
  double local_20;
  
  if ((*(byte *)(*in_RDI + 0x28d6) & 1) != 0) {
    lVar1 = *in_RDI;
    lVar2 = *in_RDI;
    if ((int)in_RDI[10] < (int)in_RDI[2]) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x21b8),
                          (long)(int)in_RDI[10]);
      local_20 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x21d0),
                          (long)(int)in_RDI[10]);
      local_28 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x2200),
                          (long)((int)in_RDI[10] - (int)in_RDI[2]));
      local_20 = -*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar1 + 0x21e8),
                          (long)((int)in_RDI[10] - (int)in_RDI[2]));
      local_28 = -*pvVar3;
    }
    if (local_28 <= local_20) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2668),
                          (long)*(int *)((long)in_RDI + 0x4c));
      in_RDI[0xc] = (long)((*pvVar4 - local_20) / (double)in_RDI[0xe]);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x25a8),
                          (long)(int)in_RDI[10]);
      *pvVar4 = local_20;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x25c0),
                          (long)(int)in_RDI[10]);
      *pvVar4 = local_20;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x25d8),
                          (long)(int)in_RDI[10]);
      *pvVar4 = 0.0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x25f0),
                          (long)*(int *)((long)in_RDI + 0x44));
      in_RDI[0xd] = (long)(*pvVar4 + (double)in_RDI[0xc]);
    }
  }
  return;
}

Assistant:

void HEkkPrimal::adjustPerturbedEquationOut() {
  if (!ekk_instance_.info_.bounds_perturbed) return;
  const HighsLp& lp = ekk_instance_.lp_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  double lp_lower;
  double lp_upper;
  if (variable_out < num_col) {
    lp_lower = lp.col_lower_[variable_out];
    lp_upper = lp.col_upper_[variable_out];
  } else {
    lp_lower = -lp.row_upper_[variable_out - num_col];
    lp_upper = -lp.row_lower_[variable_out - num_col];
  }
  if (lp_lower < lp_upper) return;
  // Leaving variable is fixed
  //  double save_theta_primal = theta_primal;
  double true_fixed_value = lp_lower;
  // Modify theta_primal so that variable leaves at true fixed value
  theta_primal = (info.baseValue_[row_out] - true_fixed_value) / alpha_col;
  /*
    printf("For equation %4" HIGHSINT_FORMAT " to be nonbasic at RHS %10.4g
    requires theta_primal to change by %10.4g from %10.4g to %10.4g\n",
    variable_out, true_fixed_value, theta_primal-save_theta_primal,
    save_theta_primal, theta_primal);
  */
  info.workLower_[variable_out] = true_fixed_value;
  info.workUpper_[variable_out] = true_fixed_value;
  info.workRange_[variable_out] = 0;
  value_in = info.workValue_[variable_in] + theta_primal;
}